

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.h
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::UserEntryLess::operator()
          (UserEntryLess *this,UserEntry *lhs,UserEntry *rhs)

{
  uint uVar1;
  uint uVar2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  bool bVar5;
  
  pIVar3 = lhs->def;
  pIVar4 = rhs->def;
  if (pIVar4 != (Instruction *)0x0 && pIVar3 == (Instruction *)0x0) {
    return true;
  }
  if (pIVar3 == (Instruction *)0x0 || pIVar4 != (Instruction *)0x0) {
    if (pIVar3 != (Instruction *)0x0 && pIVar4 != (Instruction *)0x0) {
      uVar1 = pIVar3->unique_id_;
      if ((uVar1 == 0) || (uVar2 = pIVar4->unique_id_, uVar2 == 0)) goto LAB_005a06c7;
      if (uVar1 < uVar2) {
        return true;
      }
      if (uVar1 >= uVar2 && uVar1 != uVar2) goto LAB_005a0664;
    }
    pIVar3 = lhs->user;
    pIVar4 = rhs->user;
    if (pIVar4 != (Instruction *)0x0 && pIVar3 != (Instruction *)0x0) {
      if ((pIVar3->unique_id_ == 0) || (pIVar4->unique_id_ == 0)) {
LAB_005a06c7:
        __assert_fail("unique_id_ != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0xfb,"uint32_t spvtools::opt::Instruction::unique_id() const");
      }
      bVar5 = pIVar3->unique_id_ < pIVar4->unique_id_;
    }
    else {
      bVar5 = pIVar3 == (Instruction *)0x0 && pIVar4 != (Instruction *)0x0;
    }
  }
  else {
LAB_005a0664:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool operator()(const UserEntry& lhs, const UserEntry& rhs) const {
    // If lhs.def and rhs.def are both null, fall through to checking the
    // second entries.
    if (!lhs.def && rhs.def) return true;
    if (lhs.def && !rhs.def) return false;

    // If neither definition is null, then compare unique ids.
    if (lhs.def && rhs.def) {
      if (lhs.def->unique_id() < rhs.def->unique_id()) return true;
      if (rhs.def->unique_id() < lhs.def->unique_id()) return false;
    }

    // Return false on equality.
    if (!lhs.user && !rhs.user) return false;
    if (!lhs.user) return true;
    if (!rhs.user) return false;

    // If neither user is null then compare unique ids.
    return lhs.user->unique_id() < rhs.user->unique_id();
  }